

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O2

bool __thiscall flatbuffers::ts::TsGenerator::generateBundle(TsGenerator *this)

{
  ostream *poVar1;
  string cmd;
  string bundlepath;
  string inputpath;
  string symbolic_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30 [32];
  
  if ((((this->super_BaseGenerator).parser_)->opts).ts_flat_files == true) {
    local_70 = local_60;
    local_68 = 0;
    local_60[0] = 0;
    std::__cxx11::string::string(local_30,(string *)(this->super_BaseGenerator).file_name_);
    std::operator+(&local_b0,(this->super_BaseGenerator).path_,
                   (this->super_BaseGenerator).file_name_);
    std::operator+(&local_90,&local_b0,".ts");
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    BaseGenerator::GeneratedFileName
              (&local_90,&this->super_BaseGenerator,(this->super_BaseGenerator).path_,
               (this->super_BaseGenerator).file_name_,&((this->super_BaseGenerator).parser_)->opts);
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_90);
    std::operator+(&local_b0,&local_50,".js");
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"esbuild",(allocator<char> *)&local_50);
    std::__cxx11::string::append((char *)&local_b0);
    std::__cxx11::string::append((string *)&local_b0);
    std::__cxx11::string::append((char *)&local_b0);
    std::__cxx11::string::append((string *)&local_b0);
    std::__cxx11::string::append((char *)&local_b0);
    poVar1 = std::operator<<((ostream *)&std::cout,"Entry point ");
    poVar1 = std::operator<<(poVar1,(string *)&local_70);
    poVar1 = std::operator<<(poVar1," generated.");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "A single file bundle can be created using fx. esbuild with:");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"> ");
    poVar1 = std::operator<<(poVar1,(string *)&local_b0);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string(local_30);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return true;
}

Assistant:

bool generateBundle() {
    if (parser_.opts.ts_flat_files) {
      std::string inputpath;
      std::string symbolic_name = file_name_;
      inputpath = path_ + file_name_ + ".ts";
      std::string bundlepath =
          GeneratedFileName(path_, file_name_, parser_.opts);
      bundlepath = bundlepath.substr(0, bundlepath.size() - 3) + ".js";
      std::string cmd = "esbuild";
      cmd += " ";
      cmd += inputpath;
      // cmd += " --minify";
      cmd += " --format=cjs --bundle --outfile=";
      cmd += bundlepath;
      cmd += " --external:flatbuffers";
      std::cout << "Entry point " << inputpath << " generated." << std::endl;
      std::cout << "A single file bundle can be created using fx. esbuild with:"
                << std::endl;
      std::cout << "> " << cmd << std::endl;
    }
    return true;
  }